

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

void __thiscall libchars::commands::auto_complete(commands *this)

{
  size_type *psVar1;
  filter_t fVar2;
  size_t *psVar3;
  size_t sVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  _Self __tmp_1;
  debug *pdVar9;
  token *ptVar10;
  command_node **ppcVar11;
  _Node *p_Var12;
  _List_node_base *p_Var13;
  size_t *psVar14;
  undefined8 uVar15;
  char *pcVar16;
  pointer pcVar17;
  char *pcVar18;
  _Self __tmp;
  token *ptVar19;
  ulong uVar20;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 uVar23;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  double dVar22;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  double in_XMM1_Qa;
  undefined1 local_1d8 [8];
  command_cursor cw;
  long local_140 [2];
  command_node *local_130;
  size_t *local_128;
  size_t *local_120;
  undefined1 local_118 [8];
  command_cursor ci;
  string available_str;
  size_t t_offset;
  string_list_t options;
  string prefix;
  
  pdVar9 = debug::initialize(0);
  debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  local_130 = &this->root;
  local_120 = &(this->super_edit_object).cursor;
  do {
    if ((this->super_edit_object).insert_idx < (this->super_edit_object).buflen) {
      return;
    }
    available_str.field_2._8_8_ = 0;
    ptVar10 = find_current_token(this,(size_t *)(available_str.field_2._M_local_buf + 8));
    pdVar9 = debug::initialize(0);
    uVar15 = available_str.field_2._8_8_;
    if (ptVar10 == (token *)0x0) {
      debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    }
    else {
      debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      if ((ulong)uVar15 < ptVar10->length) {
        return;
      }
      if ((ptVar10->status & 0x400) != 0) {
        return;
      }
    }
    ci.idx = (size_t)&available_str._M_string_length;
    available_str._M_dataplus._M_p = (pointer)0x0;
    available_str._M_string_length._0_1_ = 0;
    ptVar19 = this->t_cmd;
    while( true ) {
      if ((ptVar19 == (token *)0x0) || (ptVar19->length == 0)) goto LAB_0010cda3;
      if (ptVar19 == ptVar10) break;
      std::__cxx11::string::_M_append((char *)&ci.idx,(ulong)(ptVar19->value)._M_dataplus._M_p);
      std::__cxx11::string::push_back((char)&ci.idx);
      ptVar19 = ptVar19->next;
    }
    if ((ulong)available_str.field_2._8_8_ < ptVar10->length) {
      std::__cxx11::string::append((string *)&ci.idx,(ulong)ptVar19,0);
    }
    else {
      std::__cxx11::string::_M_append((char *)&ci.idx,(ulong)(ptVar19->value)._M_dataplus._M_p);
    }
LAB_0010cda3:
    command_cursor::command_cursor((command_cursor *)local_118,local_130,0);
    bVar6 = true;
    for (ptVar19 = this->t_cmd; ptVar19 != (token *)0x0; ptVar19 = ptVar19->next) {
      ppcVar11 = (command_node **)((long)&ci.w.field_2 + 8);
      if (ci.S.c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_start._M_node !=
          (_Map_pointer)
          ci.S.c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_map_size) {
        ppcVar11 = (command_node **)
                   ci.S.c.
                   super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        if ((_Elt_pointer)
            ci.S.c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_node ==
            ci.S.c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur) {
          ppcVar11 = &ci.S.c.
                      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last[-1][5].next;
        }
        ppcVar11 = ppcVar11 + -1;
      }
      if ((~bVar6 & 1U) != 0 || *ppcVar11 == (command_node *)0x0) break;
      pdVar9 = debug::initialize(0);
      debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if (ptVar19 == ptVar10) {
        if (available_str.field_2._8_8_ == 0) {
          bVar6 = false;
        }
        else {
          std::__cxx11::string::substr((ulong)local_1d8,(ulong)ptVar19);
          pdVar9 = debug::initialize(0);
          debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
          bVar6 = command_cursor::find
                            ((command_cursor *)local_118,(string *)local_1d8,this->mask,false);
          if (local_1d8 !=
              (undefined1  [8])
              &cw.S.c.
               super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
               ._M_impl.super__Deque_impl_data._M_map_size) {
            operator_delete((void *)local_1d8,
                            cw.S.c.
                            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                            ._M_impl.super__Deque_impl_data._M_map_size + 1);
          }
        }
        break;
      }
      bVar6 = command_cursor::find((command_cursor *)local_118,&ptVar19->value,this->mask,false);
      if (bVar6) {
        bVar6 = command_cursor::next_root((command_cursor *)local_118);
      }
      else {
        bVar6 = false;
      }
    }
    pdVar9 = debug::initialize(0);
    debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
    ppcVar11 = (command_node **)((long)&ci.w.field_2 + 8);
    if (ci.S.c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_start._M_node !=
        (_Map_pointer)
        ci.S.c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_map_size) {
      ppcVar11 = (command_node **)
                 ci.S.c.
                 super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      if ((_Elt_pointer)
          ci.S.c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_start._M_node ==
          ci.S.c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur) {
        ppcVar11 = &ci.S.c.
                    super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last[-1][5].next;
      }
      ppcVar11 = ppcVar11 + -1;
    }
    if (*ppcVar11 != (command_node *)0x0) {
      pdVar9 = debug::initialize(0);
      debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
    }
    if (bVar6 == false) {
      pdVar9 = debug::initialize(0);
      bVar6 = false;
      debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
    }
    else {
      t_offset = (size_t)&t_offset;
      options.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      options.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)t_offset;
      pdVar9 = debug::initialize(0);
      debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
      command_cursor::command_cursor((command_cursor *)local_1d8,(command_cursor *)local_118);
      bVar6 = false;
      while( true ) {
        bVar7 = command_cursor::next((command_cursor *)local_1d8);
        dVar22 = (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
        if (!bVar7) break;
        if (cw.w._M_dataplus._M_p != (pointer)0x0) {
          command_cursor::remainder_abi_cxx11_
                    ((command_cursor *)
                     &options.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl._M_node._M_size,
                     (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06),in_XMM1_Qa);
          _Var5 = prefix._M_dataplus;
          if ((size_type *)
              options.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size != &prefix._M_string_length) {
            operator_delete((void *)options.
                                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl._M_node._M_size,
                            CONCAT71(prefix._M_string_length._1_7_,
                                     (undefined1)prefix._M_string_length) + 1);
          }
          if (_Var5._M_p == (pointer)0x0) {
            fVar2 = this->mask;
            bVar7 = command_cursor::command((command_cursor *)local_1d8,fVar2,false);
            if ((bVar7) ||
               (bVar7 = command_cursor::subword((command_cursor *)local_1d8,fVar2,false), bVar7)) {
              pdVar9 = debug::initialize(0);
              debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
              p_Var12 = std::__cxx11::
                        list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        _M_create_node<std::__cxx11::string_const&>
                                  ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&t_offset,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&cw.S.c.
                                       super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_node);
              std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
              options.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_prev =
                   (_List_node_base *)
                   ((long)&(options.
                            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
              bVar6 = command_cursor::command((command_cursor *)local_1d8,this->mask,false);
            }
          }
        }
      }
      if ((size_t *)t_offset != &t_offset) {
        dVar22 = command_cursor::remainder_abi_cxx11_
                           ((command_cursor *)
                            &options.
                             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl._M_node._M_size,
                            (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06),in_XMM1_Qa);
        _Var5 = prefix._M_dataplus;
        uVar21 = SUB84(dVar22,0);
        uVar23 = (undefined4)((ulong)dVar22 >> 0x20);
        if ((size_type *)
            options.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size != &prefix._M_string_length) {
          operator_delete((void *)options.
                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl._M_node._M_size,
                          CONCAT71(prefix._M_string_length._1_7_,(undefined1)prefix._M_string_length
                                  ) + 1);
          uVar21 = extraout_XMM0_Da_09;
          uVar23 = extraout_XMM0_Db_09;
        }
        dVar22 = (double)CONCAT44(uVar23,uVar21);
        if (_Var5._M_p == (pointer)0x0) {
          fVar2 = this->mask;
          bVar7 = command_cursor::command((command_cursor *)local_118,fVar2,false);
          if (!bVar7) {
            bVar7 = command_cursor::subword((command_cursor *)local_118,fVar2,false);
            dVar22 = (double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10);
            if (!bVar7) goto LAB_0010d33d;
          }
          pdVar9 = debug::initialize(0);
          dVar22 = debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11));
          options.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size = (size_t)&prefix._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>
                    (SUB84(dVar22,0),
                     &options.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl._M_node._M_size,"");
          p_Var13 = (_List_node_base *)operator_new(0x30);
          p_Var13[1]._M_next = p_Var13 + 2;
          psVar1 = &prefix._M_string_length;
          if ((size_type *)
              options.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size == psVar1) {
            p_Var13[2]._M_next =
                 (_List_node_base *)
                 CONCAT71(prefix._M_string_length._1_7_,(undefined1)prefix._M_string_length);
            p_Var13[2]._M_prev = (_List_node_base *)prefix.field_2._M_allocated_capacity;
          }
          else {
            p_Var13[1]._M_next =
                 (_List_node_base *)
                 options.
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node._M_size;
            p_Var13[2]._M_next =
                 (_List_node_base *)
                 CONCAT71(prefix._M_string_length._1_7_,(undefined1)prefix._M_string_length);
          }
          p_Var13[1]._M_prev = (_List_node_base *)prefix._M_dataplus._M_p;
          prefix._M_dataplus._M_p = (pointer)0x0;
          prefix._M_string_length._0_1_ = 0;
          options.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size = (size_t)psVar1;
          dVar22 = (double)std::__detail::_List_node_base::_M_hook(p_Var13);
          options.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev =
               (_List_node_base *)
               ((long)&(options.
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
          if ((size_type *)
              options.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size != psVar1) {
            operator_delete((void *)options.
                                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl._M_node._M_size,
                            CONCAT71(prefix._M_string_length._1_7_,
                                     (undefined1)prefix._M_string_length) + 1);
            dVar22 = (double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12);
          }
        }
      }
LAB_0010d33d:
      if ((size_t *)t_offset == &t_offset) {
        if (ci.w._M_dataplus._M_p != (pointer)0x0) {
          command_cursor::remainder_abi_cxx11_
                    ((command_cursor *)
                     &options.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl._M_node._M_size,dVar22,in_XMM1_Qa);
          _Var5 = prefix._M_dataplus;
          if ((size_type *)
              options.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size != &prefix._M_string_length) {
            operator_delete((void *)options.
                                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl._M_node._M_size,
                            CONCAT71(prefix._M_string_length._1_7_,
                                     (undefined1)prefix._M_string_length) + 1);
          }
          if (_Var5._M_p == (pointer)0x0) {
            pdVar9 = debug::initialize(0);
            dVar22 = debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14));
            (*(this->super_edit_object)._vptr_edit_object[4])(SUB84(dVar22,0),this,0x20);
            goto LAB_0010d5fe;
          }
        }
LAB_0010d5f9:
        bVar6 = false;
      }
      else {
        if (options.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_prev != (_List_node_base *)0x1) {
          options.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size = (size_t)&prefix._M_string_length;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     &options.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl._M_node._M_size,*(long *)(t_offset + 0x10),
                     *(long *)(t_offset + 0x18) + *(long *)(t_offset + 0x10));
          if (prefix._M_dataplus._M_p != (pointer)0x0) {
            psVar14 = *(size_t **)t_offset;
            while( true ) {
              if (psVar14 == &t_offset) {
                for (pcVar17 = (pointer)0x0; pcVar17 < prefix._M_dataplus._M_p;
                    pcVar17 = pcVar17 + 1) {
                  (*(this->super_edit_object)._vptr_edit_object[4])
                            (this,(ulong)(uint)(int)pcVar17[options.
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node._M_size]);
                }
                parse(this);
                goto LAB_0010d5d0;
              }
              local_128 = (size_t *)*psVar14;
              if (prefix._M_dataplus._M_p <= (pointer)psVar14[3]) goto LAB_0010d4e2;
              psVar3 = &options.
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl._M_node._M_size;
              std::__cxx11::string::substr((ulong)&cw.idx,(ulong)psVar3);
              std::__cxx11::string::operator=((string *)psVar3,(string *)&cw.idx);
              if ((long *)cw.idx != local_140) {
                operator_delete((void *)cw.idx,local_140[0] + 1);
              }
              if (prefix._M_dataplus._M_p == (pointer)0x0) break;
LAB_0010d4e2:
              while (iVar8 = std::__cxx11::string::compare
                                       ((ulong)(psVar14 + 2),0,(string *)prefix._M_dataplus._M_p),
                    iVar8 != 0) {
                pcVar17 = prefix._M_dataplus._M_p + -1;
                if (prefix._M_dataplus._M_p == (pointer)0x0) {
                  uVar15 = std::__throw_out_of_range_fmt
                                     ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                      "basic_string::erase",pcVar17,0);
                  if ((size_type *)
                      options.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl._M_node._M_size != &prefix._M_string_length) {
                    operator_delete((void *)options.
                                            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl._M_node._M_size,
                                    CONCAT71(prefix._M_string_length._1_7_,
                                             (undefined1)prefix._M_string_length) + 1);
                  }
                  command_cursor::~command_cursor((command_cursor *)local_1d8);
                  std::__cxx11::
                  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&t_offset);
                  command_cursor::~command_cursor((command_cursor *)local_118);
                  if ((size_type *)ci.idx != &available_str._M_string_length) {
                    operator_delete((void *)ci.idx,
                                    CONCAT71(available_str._M_string_length._1_7_,
                                             (undefined1)available_str._M_string_length) + 1);
                  }
                  _Unwind_Resume(uVar15);
                }
                pcVar17[options.
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl._M_node._M_size] = '\0';
                prefix._M_dataplus._M_p = pcVar17;
                if (pcVar17 == (pointer)0x0) goto LAB_0010d52d;
              }
              psVar14 = local_128;
              if (prefix._M_dataplus._M_p == (pointer)0x0) break;
            }
          }
LAB_0010d52d:
          putchar(10);
          psVar14 = (size_t *)t_offset;
          if ((size_t *)t_offset != &t_offset) {
            do {
              pcVar18 = "";
              pcVar16 = "";
              if (((this->edit).driver)->control_enabled != false) {
                pcVar16 = "\x1b[0;36m";
                pcVar18 = "\x1b[0m";
              }
              psVar3 = (size_t *)*psVar14;
              printf("%s%s%s%s%s\n",pcVar18,ci.idx,pcVar16,psVar14[2],pcVar18);
              psVar14 = psVar3;
            } while (psVar3 != &t_offset);
          }
          *local_120 = 0;
          local_120[1] = 0;
LAB_0010d5d0:
          if ((size_type *)
              options.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size != &prefix._M_string_length) {
            operator_delete((void *)options.
                                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl._M_node._M_size,
                            CONCAT71(prefix._M_string_length._1_7_,
                                     (undefined1)prefix._M_string_length) + 1);
          }
          goto LAB_0010d5f9;
        }
        pdVar9 = debug::initialize(0);
        debug::log(pdVar9,(double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13));
        sVar4 = t_offset;
        for (uVar20 = 0; uVar20 < *(ulong *)(sVar4 + 0x18); uVar20 = uVar20 + 1) {
          (*(this->super_edit_object)._vptr_edit_object[4])
                    (this,(ulong)(uint)(int)*(char *)(*(long *)(sVar4 + 0x10) + uVar20));
        }
        parse(this);
        if (bVar6 != false) goto LAB_0010d5f9;
LAB_0010d5fe:
        bVar6 = true;
      }
      if (cw.S.c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_node != (_Map_pointer)&cw.w._M_string_length)
      {
        operator_delete(cw.S.c.
                        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node,cw.w._M_string_length + 1)
        ;
      }
      std::_Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::
      ~_Deque_base((_Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                    *)local_1d8);
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&t_offset);
    }
    if (ci.S.c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_node != (_Map_pointer)&ci.w._M_string_length) {
      operator_delete(ci.S.c.
                      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node,ci.w._M_string_length + 1);
    }
    std::_Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::
    ~_Deque_base((_Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *
                 )local_118);
    if ((size_type *)ci.idx != &available_str._M_string_length) {
      operator_delete((void *)ci.idx,
                      CONCAT71(available_str._M_string_length._1_7_,
                               (undefined1)available_str._M_string_length) + 1);
    }
    if (!bVar6) {
      return;
    }
  } while( true );
}

Assistant:

void commands::auto_complete()
    {
        LC_LOG_VERBOSE("complete@%zu/%zu",insert_idx,length());

        // only allowed at end of line + on command tokens (no quotes)
        while (insert_idx >= length()) {
            // sanity check on position in line + type of token
            size_t t_offset = 0;
            token *Tcur = find_current_token(t_offset);
            if (Tcur != NULL) {
                LC_LOG_VERBOSE("current token [%p/%s@%zu+%zu] @ %zu",Tcur,Tcur->value.c_str(),Tcur->offset,Tcur->length,t_offset);
                if (t_offset < Tcur->length || (Tcur->status & token::IS_QUOTED))
                    return;
            }
            else {
                LC_LOG_VERBOSE("** no current token **");
            }

            std::string available_str;
            token *T = t_cmd;
            while (T != NULL && T->length > 0) {
                if (T == Tcur) {
                    if (t_offset < Tcur->length) {
                        available_str.append(T->value, 0, t_offset);
                    }
                    else {
                        available_str.append(T->value);
                    }
                    break;
                }
                else {
                    available_str.append(T->value);
                    available_str += ' ';
                }
                T = T->next;
            }

            // find current position in command dictionary
            command_cursor ci(&root);
            T = t_cmd;
            bool available = true;
            while (T != NULL && ci.valid() && available) {
                LC_LOG_VERBOSE("search token [%p/%s@%zu+%zu]",T,T->value.c_str(),T->offset,T->length);
                if (T == Tcur) {
                    if (t_offset > 0) {
                        std::string v_search = T->value.substr(0,t_offset);
                        LC_LOG_VERBOSE("offset[%zu]; search for [%s]",t_offset,v_search.c_str());
                        available = ci.find(v_search,mask);
                    }
                    else {
                        available = false;
                    }
                    T = NULL;
                }
                else {
                    available = ci.find(T->value,mask);
                    available = available && ci.next_root();
                    T = T->next;
                }
            }

            LC_LOG_DEBUG("cursor: %p @ %zu: [%s]", ci.current(), ci.current_idx(), ci.word().c_str());
            if (ci.valid())
                LC_LOG_VERBOSE("dictionary option: [%s]",ci.current()->part.c_str());

            if (!available) {
                LC_LOG_DEBUG("** no options available **");
                return;
            }

            // collect combinations (full words + words with sub-words + words with valid commands)
            typedef std::list<std::string> string_list_t;
            string_list_t options;
            bool is_command = false;
            LC_LOG_VERBOSE("current partial word: [%s]",ci.word().c_str());
            command_cursor cw(ci);
            while (cw.next()) {
                if (!cw.word().empty() && cw.end() && (cw.command(mask) || cw.subword(mask))) {
                    LC_LOG_VERBOSE("options += %s[%s]", ci.word().c_str(), cw.word().c_str());
                    options.push_back(cw.word());
                    is_command = cw.command(mask);
                }
            }
            if (!options.empty() && ci.end() && (ci.command(mask) || ci.subword(mask))) {
                LC_LOG_VERBOSE("options += <cr>");
                options.push_back("");
            }

            if (options.empty()) {
                if (!ci.word().empty() && ci.end()) {
                    // end-of-word --> add space
                    LC_LOG_DEBUG("insert space");
                    insert(' ');
                    // no need to reparse because whitespace does not change token list
                }
                else {
                    return;
                }
            }
            else if (options.size() == 1) {
                // middle-of-word --> complete word (take first option)
                // line empty / after whitespace + 1 path --> add word
                LC_LOG_DEBUG("insert(middle/empty) [%s]",options.front().c_str());
                const std::string &word_to_insert = options.front();
                size_t i = 0;
                while (i < word_to_insert.size())
                    insert(word_to_insert.at(i++));
                // reparse before next iteration of loop
                parse();
                // stop auto-complete if new string is a valid command
                if (is_command)
                    return;
            }
            else {
                // 2+ options --> find longest common prefix amongst options
                std::string prefix = options.front();
                string_list_t::const_iterator si = options.begin();
                ++si;
                while (!prefix.empty() && si != options.end()) {
                    const std::string &cmp_str = *si++;
                    if (cmp_str.length() < prefix.length())
                        prefix = prefix.substr(0,cmp_str.length());
                    while (!prefix.empty() && cmp_str.compare(0,prefix.length(),prefix) != 0)
                        prefix.erase(prefix.length() - 1);
                }

                if (!prefix.empty()) {
                    // common prefix available --> add prefix
                    size_t i = 0;
                    while (i < prefix.size())
                        insert(prefix.at(i++));
                    // reparse before next iteration of loop
                    parse();
                }
                else {
                    // dump available options
                    printf("\n");
                    string_list_t::const_iterator si = options.begin();
                    while (si != options.end()) {
                        printf("%s%s%s%s%s\n",
                            color_str(COLOR_NORMAL),
                            available_str.c_str(),
                            color_str(COLOR_COMPLETION),
                            (si++)->c_str(),
                            color_str(COLOR_NORMAL));
                    }
                    rewind();
                }
                return;
            }
        }
    }